

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O3

int xmlBufCCat(xmlBufPtr buf,char *str)

{
  xmlChar xVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  xmlChar *pxVar6;
  
  iVar2 = -1;
  if ((buf != (xmlBufPtr)0x0) && (buf->error == 0)) {
    uVar5 = (ulong)buf->compat_size;
    if ((uVar5 < 0x7fffffff) && (buf->size != uVar5)) {
      buf->size = uVar5;
    }
    uVar3 = (ulong)buf->compat_use;
    uVar5 = buf->use;
    if (buf->use != uVar3 && uVar3 < 0x7fffffff) {
      buf->use = uVar3;
      uVar5 = uVar3;
    }
    if ((str != (char *)0x0) && (buf->alloc != XML_BUFFER_ALLOC_IMMUTABLE)) {
      xVar1 = *str;
      if (xVar1 != '\0') {
        pxVar6 = (xmlChar *)(str + 1);
        do {
          sVar4 = buf->use;
          if (buf->size <= sVar4 + 10) {
            iVar2 = xmlBufResize(buf,sVar4 + 10);
            if (iVar2 == 0) {
              __xmlSimpleError(0x1d,2,(xmlNodePtr)0x0,(char *)0x0,"growing buffer");
              if (buf->error != 0) {
                return 2;
              }
              buf->error = 2;
              return 2;
            }
            xVar1 = pxVar6[-1];
            sVar4 = buf->use;
          }
          buf->use = sVar4 + 1;
          buf->content[sVar4] = xVar1;
          xVar1 = *pxVar6;
          pxVar6 = pxVar6 + 1;
        } while (xVar1 != '\0');
        uVar5 = buf->use;
      }
      buf->content[uVar5] = '\0';
      uVar5 = buf->size;
      if (0x7ffffffe < uVar5) {
        uVar5 = 0x7fffffff;
      }
      buf->compat_size = (uint)uVar5;
      uVar5 = 0x7fffffff;
      if (buf->use < 0x7fffffff) {
        uVar5 = buf->use;
      }
      buf->compat_use = (uint)uVar5;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int
xmlBufCCat(xmlBufPtr buf, const char *str) {
    const char *cur;

    if ((buf == NULL) || (buf->error))
        return(-1);
    CHECK_COMPAT(buf)
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) return -1;
    if (str == NULL) {
#ifdef DEBUG_BUFFER
        xmlGenericError(xmlGenericErrorContext,
		"xmlBufCCat: str == NULL\n");
#endif
	return -1;
    }
    for (cur = str;*cur != 0;cur++) {
        if (buf->use  + 10 >= buf->size) {
            if (!xmlBufResize(buf, buf->use+10)){
		xmlBufMemoryError(buf, "growing buffer");
                return XML_ERR_NO_MEMORY;
            }
        }
        buf->content[buf->use++] = *cur;
    }
    buf->content[buf->use] = 0;
    UPDATE_COMPAT(buf)
    return 0;
}